

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int header_set_durable(HEADER_HANDLE header,_Bool durable_value)

{
  int iVar1;
  AMQP_VALUE item_value;
  AMQP_VALUE durable_amqp_value;
  HEADER_INSTANCE *header_instance;
  int result;
  _Bool durable_value_local;
  HEADER_HANDLE header_local;
  
  if (header == (HEADER_HANDLE)0x0) {
    header_instance._0_4_ = 0x39fe;
  }
  else {
    item_value = amqpvalue_create_boolean(durable_value);
    if (item_value == (AMQP_VALUE)0x0) {
      header_instance._0_4_ = 0x3a06;
    }
    else {
      iVar1 = amqpvalue_set_composite_item(header->composite_value,0,item_value);
      if (iVar1 == 0) {
        header_instance._0_4_ = 0;
      }
      else {
        header_instance._0_4_ = 0x3a0c;
      }
      amqpvalue_destroy(item_value);
    }
  }
  return (int)header_instance;
}

Assistant:

int header_set_durable(HEADER_HANDLE header, bool durable_value)
{
    int result;

    if (header == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        HEADER_INSTANCE* header_instance = (HEADER_INSTANCE*)header;
        AMQP_VALUE durable_amqp_value = amqpvalue_create_boolean(durable_value);
        if (durable_amqp_value == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (amqpvalue_set_composite_item(header_instance->composite_value, 0, durable_amqp_value) != 0)
            {
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }

            amqpvalue_destroy(durable_amqp_value);
        }
    }

    return result;
}